

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::PortPackedStruct::PortPackedStruct
          (PortPackedStruct *this,Generator *m,PortDirection direction,string *name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  shared_ptr<kratos::PackedStruct> *packed_struct__local;
  string *name_local;
  PortDirection direction_local;
  Generator *m_local;
  PortPackedStruct *this_local;
  
  Port::Port(&this->super_Port,m,direction,name,1,size,Data,false);
  PackedInterface::PackedInterface(&this->super_PackedInterface);
  (this->super_Port).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00592a20;
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__00592ba8;
  std::shared_ptr<kratos::PackedStruct>::shared_ptr(&this->struct_,packed_struct_);
  setup_size(this);
  return;
}

Assistant:

PortPackedStruct::PortPackedStruct(Generator* m, PortDirection direction, const std::string& name,
                                   std::shared_ptr<PackedStruct> packed_struct_,
                                   const std::vector<uint32_t>& size)
    : Port(m, direction, name, 1, size, PortType::Data, false), struct_(std::move(packed_struct_)) {
    setup_size();
}